

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O0

XrResult LoaderInstance::CreateInstance
                   (PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                   PFN_xrCreateInstance create_instance_term,
                   PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces,XrInstanceCreateInfo *info,
                   unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance
                   )

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  reverse_iterator rVar3;
  pointer instance_00;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *this;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *create_info;
  bool bVar4;
  int iVar5;
  RuntimeInterface *pRVar6;
  array<XrExtensionProperties,_1UL> *this_00;
  const_iterator pvVar7;
  size_type sVar8;
  ulong uVar9;
  XrApiLayerNextInfo *pXVar10;
  type pXVar11;
  reference puVar12;
  pointer pAVar13;
  char *pcVar14;
  LoaderInstance *this_01;
  pointer pLVar15;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *this_02;
  XrInstance pXVar16;
  XrInstance *extraout_RDX;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_8b8;
  string local_898;
  allocator local_871;
  string local_870;
  string local_850;
  ostringstream local_830 [8];
  ostringstream oss;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  local_6b0;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_698;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  undefined4 local_630;
  undefined4 local_62c;
  XrApiLayerCreateInfo api_layer_ci;
  PFN_xrCreateApiLayerInstance cur_cali_fp;
  PFN_xrGetInstanceProcAddr cur_gipa_fp;
  reverse_iterator layer_interface_1;
  XrApiLayerNextInfo *topmost_nextinfo;
  PFN_xrCreateApiLayerInstance topmost_cali_fp;
  size_t i;
  size_t ni_index;
  unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_> next_info_list;
  string local_3a0;
  const_iterator local_380;
  value_type *ext_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  array<XrExtensionProperties,_1UL> *__range3_2;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_skip;
  XrInstanceCreateInfo *modified_create_info;
  InstanceCreateInfoManager create_info_manager;
  XrInstance instance;
  PFN_xrGetInstanceProcAddr topmost_gipa;
  pointer pXStack_1c0;
  pointer local_1b8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  undefined1 local_178 [8];
  string msg;
  string local_150;
  reference local_130;
  unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> *layer_interface;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *__range3_1;
  value_type *loader_extension;
  const_iterator __end3;
  const_iterator __begin3;
  array<XrExtensionProperties,_1UL> *__range3;
  string local_e8;
  byte local_c1;
  uint local_c0;
  XrResult XStack_bc;
  bool found;
  uint32_t ext;
  XrResult last_error;
  pointer pXStack_b0;
  pointer local_a8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *local_38;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance_local;
  XrInstanceCreateInfo *info_local;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *api_layer_interfaces_local;
  PFN_xrCreateApiLayerInstance create_api_layer_instance_term_local;
  PFN_xrCreateInstance create_instance_term_local;
  PFN_xrGetInstanceProcAddr get_instance_proc_addr_term_local;
  
  local_38 = loader_instance;
  loader_instance_local = (unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *)info;
  info_local = (XrInstanceCreateInfo *)api_layer_interfaces;
  api_layer_interfaces_local =
       (vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
        *)create_api_layer_instance_term;
  create_api_layer_instance_term_local = (PFN_xrCreateApiLayerInstance)create_instance_term;
  create_instance_term_local = (PFN_xrCreateInstance)get_instance_proc_addr_term;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"xrCreateInstance",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"Entering LoaderInstance::CreateInstance",&local_91);
  _ext = (pointer)0x0;
  pXStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&ext);
  LoaderLogger::LogVerboseMessage
            (&local_58,&local_90,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&ext);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&ext);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  XStack_bc = XR_SUCCESS;
  local_c0 = 0;
  do {
    if (*(uint *)&loader_instance_local[0x27]._M_t.
                  super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
                  super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
                  super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl <= local_c0) {
LAB_00120402:
      instance = (XrInstance)create_instance_term_local;
      create_info_manager.enabled_extensions_cstr.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (XR_ERROR_VALIDATION_FAILURE < XStack_bc) {
        anon_unknown.dwarf_3a913::InstanceCreateInfoManager::InstanceCreateInfoManager
                  ((InstanceCreateInfoManager *)&modified_create_info,
                   (XrInstanceCreateInfo *)loader_instance_local);
        extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)loader_instance_local;
        if (*(int *)&loader_instance_local[0x27]._M_t.
                     super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
                     super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl != 0) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range3_2);
          __begin3_2 = LoaderSpecificExtensions()->_M_elems;
          __end3_2 = std::array<XrExtensionProperties,_1UL>::begin
                               ((array<XrExtensionProperties,_1UL> *)__begin3_2);
          ext_1 = std::array<XrExtensionProperties,_1UL>::end
                            ((array<XrExtensionProperties,_1UL> *)__begin3_2);
          for (; __end3_2 != ext_1; __end3_2 = __end3_2 + 1) {
            local_380 = __end3_2;
            pRVar6 = RuntimeInterface::GetRuntime();
            pcVar14 = local_380->extensionName;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_3a0,pcVar14,
                       (allocator *)
                       ((long)&next_info_list._M_t.
                               super___uniq_ptr_impl<XrApiLayerNextInfo,_std::default_delete<XrApiLayerNextInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_XrApiLayerNextInfo_*,_std::default_delete<XrApiLayerNextInfo[]>_>
                               .super__Head_base<0UL,_XrApiLayerNextInfo_*,_false>._M_head_impl + 7)
                      );
            bVar4 = RuntimeInterface::SupportsExtension(pRVar6,&local_3a0);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&next_info_list._M_t.
                               super___uniq_ptr_impl<XrApiLayerNextInfo,_std::default_delete<XrApiLayerNextInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_XrApiLayerNextInfo_*,_std::default_delete<XrApiLayerNextInfo[]>_>
                               .super__Head_base<0UL,_XrApiLayerNextInfo_*,_false>._M_head_impl + 7)
                      );
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const(&)[128]>
                        ((vector<char_const*,std::allocator<char_const*>> *)&__range3_2,
                         &local_380->extensionName);
            }
          }
          extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)anon_unknown.dwarf_3a913::InstanceCreateInfoManager::FilterOutExtensions
                                  ((InstanceCreateInfoManager *)&modified_create_info,
                                   (vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   &__range3_2);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range3_2);
        }
        bVar4 = std::
                vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                ::empty(api_layer_interfaces);
        if (bVar4) {
          XStack_bc = (*create_api_layer_instance_term_local)
                                ((XrInstanceCreateInfo *)
                                 extensions_to_skip.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (XrApiLayerCreateInfo *)
                                 &create_info_manager.enabled_extensions_cstr.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,extraout_RDX);
        }
        else {
          sVar8 = std::
                  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                  ::size(api_layer_interfaces);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sVar8;
          uVar9 = SUB168(auVar2 * ZEXT816(0x128),0);
          if (SUB168(auVar2 * ZEXT816(0x128),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pXVar10 = (XrApiLayerNextInfo *)operator_new__(uVar9);
          std::unique_ptr<XrApiLayerNextInfo[],std::default_delete<XrApiLayerNextInfo[]>>::
          unique_ptr<XrApiLayerNextInfo*,std::default_delete<XrApiLayerNextInfo[]>,void,bool>
                    ((unique_ptr<XrApiLayerNextInfo[],std::default_delete<XrApiLayerNextInfo[]>> *)
                     &ni_index,pXVar10);
          sVar8 = std::
                  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                  ::size(api_layer_interfaces);
          i = sVar8 - 1;
          for (topmost_cali_fp = (PFN_xrCreateApiLayerInstance)0x0; topmost_cali_fp <= i;
              topmost_cali_fp = topmost_cali_fp + 1) {
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,(size_t)topmost_cali_fp);
            pXVar11->structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,(size_t)topmost_cali_fp);
            pXVar11->structVersion = 1;
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,(size_t)topmost_cali_fp);
            pXVar11->structSize = 0x128;
          }
          topmost_nextinfo = (XrApiLayerNextInfo *)api_layer_interfaces_local;
          layer_interface_1.current._M_current =
               (__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>
                )(unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> *)0x0;
          std::
          vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
          ::rbegin((vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                    *)&stack0xfffffffffffffc28);
          while( true ) {
            std::
            vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
            ::rend((vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                    *)&cur_gipa_fp);
            bVar4 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                                     *)&stack0xfffffffffffffc28,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                                     *)&cur_gipa_fp);
            if (!bVar4) break;
            puVar12 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                                   *)&stack0xfffffffffffffc28);
            pAVar13 = std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>::
                      operator->(puVar12);
            pXVar16 = (XrInstance)ApiLayerInterface::GetInstanceProcAddrFuncPointer(pAVar13);
            puVar12 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                                   *)&stack0xfffffffffffffc28);
            pAVar13 = std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>::
                      operator->(puVar12);
            pXVar10 = (XrApiLayerNextInfo *)
                      ApiLayerInterface::GetCreateApiLayerInstanceFuncPointer(pAVar13);
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,i);
            puVar12 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                                   *)&stack0xfffffffffffffc28);
            pAVar13 = std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>::
                      operator->(puVar12);
            ApiLayerInterface::LayerName_abi_cxx11_((string *)&api_layer_ci.nextInfo,pAVar13);
            pcVar14 = (char *)std::__cxx11::string::c_str();
            strncpy(pXVar11->layerName,pcVar14,0xff);
            std::__cxx11::string::~string((string *)&api_layer_ci.nextInfo);
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,i);
            rVar3 = layer_interface_1;
            pXVar11->layerName[0xff] = '\0';
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,i);
            pXVar11->next = (XrApiLayerNextInfo *)rVar3.current._M_current;
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,i);
            pXVar11->nextGetInstanceProcAddr = (PFN_xrGetInstanceProcAddr)instance;
            pXVar11 = std::
                      unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
                      operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                  *)&ni_index,i);
            pXVar11->nextCreateApiLayerInstance = (PFN_xrCreateApiLayerInstance)topmost_nextinfo;
            layer_interface_1.current._M_current =
                 (__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>
                  )std::unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                   ::operator[]((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                                 *)&ni_index,i);
            i = i - 1;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>_>
                          *)&stack0xfffffffffffffc28);
            topmost_nextinfo = pXVar10;
            instance = pXVar16;
          }
          memset(&local_630,0,0x220);
          local_630 = 4;
          local_62c = 1;
          api_layer_ci.structType = 0x220;
          api_layer_ci.structVersion = 0;
          api_layer_ci.structSize = 0;
          api_layer_ci.loaderInstance._0_1_ = 0;
          api_layer_ci.settings_file_location._504_8_ =
               std::unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
               get((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_> *)
                   &ni_index);
          XStack_bc = (*(code *)topmost_nextinfo)
                                (extensions_to_skip.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&local_630,
                                 &create_info_manager.enabled_extensions_cstr.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::
          ~unique_ptr((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>
                       *)&ni_index);
        }
        if (XStack_bc < XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_650,"xrCreateInstance",&local_651);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_678,
                     "LoaderInstance::CreateInstance chained CreateInstance call failed",&local_679)
          ;
          local_698.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_698.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_698.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_698);
          LoaderLogger::LogErrorMessage(&local_650,&local_678,&local_698);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_698);
          std::__cxx11::string::~string((string *)&local_678);
          std::allocator<char>::~allocator((allocator<char> *)&local_679);
          std::__cxx11::string::~string((string *)&local_650);
          std::allocator<char>::~allocator((allocator<char> *)&local_651);
        }
        anon_unknown.dwarf_3a913::InstanceCreateInfoManager::~InstanceCreateInfoManager
                  ((InstanceCreateInfoManager *)&modified_create_info);
      }
      this = local_38;
      if (XR_ERROR_VALIDATION_FAILURE < XStack_bc) {
        this_01 = (LoaderInstance *)operator_new(0x58);
        create_info = loader_instance_local;
        instance_00 = create_info_manager.enabled_extensions_cstr.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
        ::vector(&local_6b0,api_layer_interfaces);
        LoaderInstance(this_01,(XrInstance)instance_00,(XrInstanceCreateInfo *)create_info,
                       (PFN_xrGetInstanceProcAddr)instance,&local_6b0);
        std::unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>::reset(this,this_01);
        std::
        vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
        ::~vector(&local_6b0);
        std::__cxx11::ostringstream::ostringstream(local_830);
        std::operator<<((ostream *)local_830,"LoaderInstance::CreateInstance succeeded with ");
        pLVar15 = std::unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>::operator->
                            (local_38);
        this_02 = LayerInterfaces(pLVar15);
        sVar8 = std::
                vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                ::size(this_02);
        std::ostream::operator<<(local_830,sVar8);
        std::operator<<((ostream *)local_830,
                        " layers enabled and runtime interface - created instance = ");
        pLVar15 = std::unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>::operator->
                            (local_38);
        pXVar16 = GetInstanceHandle(pLVar15);
        HandleToHexString<XrInstance_T*>(&local_850,pXVar16);
        std::operator<<((ostream *)local_830,(string *)&local_850);
        std::__cxx11::string::~string((string *)&local_850);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_870,"xrCreateInstance",&local_871);
        std::__cxx11::ostringstream::str();
        local_8b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_8b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_8b8);
        LoaderLogger::LogInfoMessage(&local_870,&local_898,&local_8b8);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_8b8);
        std::__cxx11::string::~string((string *)&local_898);
        std::__cxx11::string::~string((string *)&local_870);
        std::allocator<char>::~allocator((allocator<char> *)&local_871);
        std::__cxx11::ostringstream::~ostringstream(local_830);
      }
      return XStack_bc;
    }
    local_c1 = 0;
    pRVar6 = RuntimeInterface::GetRuntime();
    pp_Var1 = (&(loader_instance_local[0x28]._M_t.
                 super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
                 super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
                 super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->_vptr_LoaderInstance)
              [local_c0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,(char *)pp_Var1,(allocator *)((long)&__range3 + 7));
    bVar4 = RuntimeInterface::SupportsExtension(pRVar6,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    if (bVar4) {
      local_c1 = 1;
    }
    if ((local_c1 & 1) == 0) {
      this_00 = LoaderSpecificExtensions();
      __end3 = std::array<XrExtensionProperties,_1UL>::begin(this_00);
      pvVar7 = std::array<XrExtensionProperties,_1UL>::end(this_00);
      for (; __end3 != pvVar7; __end3 = __end3 + 1) {
        iVar5 = strcmp(__end3->extensionName,
                       (char *)(&(loader_instance_local[0x28]._M_t.
                                  super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>
                                  .super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->
                                 _vptr_LoaderInstance)[local_c0]);
        if (iVar5 == 0) {
          local_c1 = 1;
          break;
        }
      }
    }
    if ((local_c1 & 1) == 0) {
      __end3_1 = std::
                 vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                 ::begin(api_layer_interfaces);
      layer_interface =
           (unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> *)
           std::
           vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
           ::end(api_layer_interfaces);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>
                                 *)&layer_interface), bVar4) {
        local_130 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>
                    ::operator*(&__end3_1);
        pAVar13 = std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>::
                  operator->(local_130);
        pp_Var1 = (&(loader_instance_local[0x28]._M_t.
                     super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
                     super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->
                    _vptr_LoaderInstance)[local_c0];
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,(char *)pp_Var1,
                   (allocator *)(msg.field_2._M_local_buf + 0xf));
        bVar4 = ApiLayerInterface::SupportsExtension(pAVar13,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        if (bVar4) {
          local_c1 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_*,_std::vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>_>
        ::operator++(&__end3_1);
      }
    }
    if ((local_c1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_178,
                 "LoaderInstance::CreateInstance, no support found for requested extension: ",
                 &local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::__cxx11::string::operator+=
                ((string *)local_178,
                 (char *)(&(loader_instance_local[0x28]._M_t.
                            super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>
                            .super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->
                           _vptr_LoaderInstance)[local_c0]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a0,"xrCreateInstance",&local_1a1);
      topmost_gipa = (PFN_xrGetInstanceProcAddr)0x0;
      pXStack_1c0 = (pointer)0x0;
      local_1b8 = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&topmost_gipa);
      LoaderLogger::LogErrorMessage
                (&local_1a0,(string *)local_178,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&topmost_gipa);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&topmost_gipa);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      XStack_bc = XR_ERROR_EXTENSION_NOT_PRESENT;
      std::__cxx11::string::~string((string *)local_178);
      goto LAB_00120402;
    }
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

XrResult LoaderInstance::CreateInstance(PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                                        PFN_xrCreateInstance create_instance_term,
                                        PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                                        std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces,
                                        const XrInstanceCreateInfo* info, std::unique_ptr<LoaderInstance>* loader_instance) {
    LoaderLogger::LogVerboseMessage("xrCreateInstance", "Entering LoaderInstance::CreateInstance");

    // Check the list of enabled extensions to make sure something supports them, and, if we do,
    // add it to the list of enabled extensions
    XrResult last_error = XR_SUCCESS;
    for (uint32_t ext = 0; ext < info->enabledExtensionCount; ++ext) {
        bool found = false;
        // First check the runtime
        if (RuntimeInterface::GetRuntime().SupportsExtension(info->enabledExtensionNames[ext])) {
            found = true;
        }
        // Next check the loader
        if (!found) {
            for (auto& loader_extension : LoaderInstance::LoaderSpecificExtensions()) {
                if (strcmp(loader_extension.extensionName, info->enabledExtensionNames[ext]) == 0) {
                    found = true;
                    break;
                }
            }
        }
        // Finally, check the enabled layers
        if (!found) {
            for (auto& layer_interface : api_layer_interfaces) {
                if (layer_interface->SupportsExtension(info->enabledExtensionNames[ext])) {
                    found = true;
                    break;
                }
            }
        }
        if (!found) {
            std::string msg = "LoaderInstance::CreateInstance, no support found for requested extension: ";
            msg += info->enabledExtensionNames[ext];
            LoaderLogger::LogErrorMessage("xrCreateInstance", msg);
            last_error = XR_ERROR_EXTENSION_NOT_PRESENT;
            break;
        }
    }

    // Topmost means "closest to the application"
    PFN_xrGetInstanceProcAddr topmost_gipa = get_instance_proc_addr_term;
    XrInstance instance{XR_NULL_HANDLE};

    if (XR_SUCCEEDED(last_error)) {
        // Remove the loader-supported-extensions (debug utils), if it's in the list of enabled extensions but not supported by
        // the runtime.
        InstanceCreateInfoManager create_info_manager{info};
        const XrInstanceCreateInfo* modified_create_info = info;
        if (info->enabledExtensionCount > 0) {
            std::vector<const char*> extensions_to_skip;
            for (const auto& ext : LoaderInstance::LoaderSpecificExtensions()) {
                if (!RuntimeInterface::GetRuntime().SupportsExtension(ext.extensionName)) {
                    extensions_to_skip.emplace_back(ext.extensionName);
                }
            }
            modified_create_info = create_info_manager.FilterOutExtensions(extensions_to_skip);
        }

        // Only start the xrCreateApiLayerInstance stack if we have layers.
        if (!api_layer_interfaces.empty()) {
            // Initialize an array of ApiLayerNextInfo structs
            std::unique_ptr<XrApiLayerNextInfo[]> next_info_list(new XrApiLayerNextInfo[api_layer_interfaces.size()]);
            size_t ni_index = api_layer_interfaces.size() - 1;
            for (size_t i = 0; i <= ni_index; i++) {
                next_info_list[i].structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
                next_info_list[i].structVersion = XR_API_LAYER_NEXT_INFO_STRUCT_VERSION;
                next_info_list[i].structSize = sizeof(XrApiLayerNextInfo);
            }

            // Go through all layers, and override the instance pointers with the layer version.  However,
            // go backwards through the layer list so we replace in reverse order so the layers can call their next function
            // appropriately.
            PFN_xrCreateApiLayerInstance topmost_cali_fp = create_api_layer_instance_term;
            XrApiLayerNextInfo* topmost_nextinfo = nullptr;
            for (auto layer_interface = api_layer_interfaces.rbegin(); layer_interface != api_layer_interfaces.rend();
                 ++layer_interface) {
                // Collect current layer's function pointers
                PFN_xrGetInstanceProcAddr cur_gipa_fp = (*layer_interface)->GetInstanceProcAddrFuncPointer();
                PFN_xrCreateApiLayerInstance cur_cali_fp = (*layer_interface)->GetCreateApiLayerInstanceFuncPointer();

                // Fill in layer info and link previous (lower) layer fxn pointers
                strncpy(next_info_list[ni_index].layerName, (*layer_interface)->LayerName().c_str(),
                        XR_MAX_API_LAYER_NAME_SIZE - 1);
                next_info_list[ni_index].layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
                next_info_list[ni_index].next = topmost_nextinfo;
                next_info_list[ni_index].nextGetInstanceProcAddr = topmost_gipa;
                next_info_list[ni_index].nextCreateApiLayerInstance = topmost_cali_fp;

                // Update saved pointers for next iteration
                topmost_nextinfo = &next_info_list[ni_index];
                topmost_gipa = cur_gipa_fp;
                topmost_cali_fp = cur_cali_fp;
                ni_index--;
            }

            // Populate the ApiLayerCreateInfo struct and pass to topmost CreateApiLayerInstance()
            XrApiLayerCreateInfo api_layer_ci = {};
            api_layer_ci.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO;
            api_layer_ci.structVersion = XR_API_LAYER_CREATE_INFO_STRUCT_VERSION;
            api_layer_ci.structSize = sizeof(XrApiLayerCreateInfo);
            api_layer_ci.loaderInstance = nullptr;  // Not used.
            api_layer_ci.settings_file_location[0] = '\0';
            api_layer_ci.nextInfo = next_info_list.get();
            //! @todo do we filter our create info extension list here?
            //! Think that actually each layer might need to filter...
            last_error = topmost_cali_fp(modified_create_info, &api_layer_ci, &instance);

        } else {
            // The loader's terminator is the topmost CreateInstance if there are no layers.
            last_error = create_instance_term(modified_create_info, &instance);
        }

        if (XR_FAILED(last_error)) {
            LoaderLogger::LogErrorMessage("xrCreateInstance", "LoaderInstance::CreateInstance chained CreateInstance call failed");
        }
    }

    if (XR_SUCCEEDED(last_error)) {
        loader_instance->reset(new LoaderInstance(instance, info, topmost_gipa, std::move(api_layer_interfaces)));

        std::ostringstream oss;
        oss << "LoaderInstance::CreateInstance succeeded with ";
        oss << (*loader_instance)->LayerInterfaces().size();
        oss << " layers enabled and runtime interface - created instance = ";
        oss << HandleToHexString((*loader_instance)->GetInstanceHandle());
        LoaderLogger::LogInfoMessage("xrCreateInstance", oss.str());
    }

    return last_error;
}